

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

void cleanup_profile(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (z_info->profile_max != 0) {
    uVar3 = 0;
    do {
      if (L'\0' < cave_profiles[uVar3].n_room_profiles) {
        lVar1 = 8;
        lVar2 = 0;
        do {
          string_free(*(char **)((long)&(cave_profiles[uVar3].room_profiles)->next + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x38;
        } while (lVar2 < cave_profiles[uVar3].n_room_profiles);
      }
      mem_free(cave_profiles[uVar3].room_profiles);
      string_free(cave_profiles[uVar3].name);
      uVar3 = uVar3 + 1;
    } while (uVar3 < z_info->profile_max);
  }
  mem_free(cave_profiles);
  return;
}

Assistant:

static void cleanup_profile(void)
{
	int i, j;
	for (i = 0; i < z_info->profile_max; i++) {
		for (j = 0; j < cave_profiles[i].n_room_profiles; j++)
			string_free((char *) cave_profiles[i].room_profiles[j].name);
		mem_free(cave_profiles[i].room_profiles);
		string_free((char *) cave_profiles[i].name);
	}
	mem_free(cave_profiles);
}